

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
cfd::core::StringUtil::StringToByte
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          string *hex_str)

{
  ulong uVar1;
  long lVar2;
  char *hex;
  uchar *bytes_out;
  size_type len;
  CfdException *this;
  allocator local_91;
  string local_90;
  CfdSourceLocation local_70;
  int local_54;
  size_type sStack_50;
  int ret;
  size_t buf_size;
  allocator<unsigned_char> local_32;
  undefined1 local_31;
  CfdSourceLocation local_30;
  string *local_18;
  string *hex_str_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer;
  
  local_18 = hex_str;
  hex_str_local = (string *)__return_storage_ptr__;
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_31 = 0;
    lVar2 = ::std::__cxx11::string::size();
    ::std::allocator<unsigned_char>::allocator(&local_32);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
               lVar2 + 1,&local_32);
    ::std::allocator<unsigned_char>::~allocator(&local_32);
    sStack_50 = 0;
    hex = (char *)::std::__cxx11::string::data();
    bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           __return_storage_ptr__);
    len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__
                    );
    local_54 = wally_hex_to_bytes(hex,bytes_out,len,&stack0xffffffffffffffb0);
    if (local_54 != 0) {
      local_70.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_util.cpp"
                   ,0x2f);
      local_70.filename = local_70.filename + 1;
      local_70.line = 0x4d7;
      local_70.funcname = "StringToByte";
      logger::warn<int&>(&local_70,"wally_hex_to_bytes NG[{}].",&local_54);
      this = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_90,"hex to byte convert error.",&local_91);
      CfdException::CfdException(this,kCfdIllegalArgumentError,&local_90);
      __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
               sStack_50);
  }
  else {
    local_30.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_30.filename = local_30.filename + 1;
    local_30.line = 0x4cd;
    local_30.funcname = "StringToByte";
    logger::info<>(&local_30,"hex_str empty. return empty buffer.");
    memset(__return_storage_ptr__,0,0x18);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> StringUtil::StringToByte(const std::string &hex_str) {
  if (hex_str.empty()) {
    info(CFD_LOG_SOURCE, "hex_str empty. return empty buffer.");
    return std::vector<uint8_t>();
  }
  std::vector<uint8_t> buffer(hex_str.size() + 1);
  size_t buf_size = 0;
  int ret = wally_hex_to_bytes(
      hex_str.data(), buffer.data(), buffer.size(), &buf_size);
  if (ret == WALLY_OK) {
    buffer.resize(buf_size);
  } else {
    warn(CFD_LOG_SOURCE, "wally_hex_to_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalArgumentError, "hex to byte convert error.");
  }

  return buffer;
}